

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall IMLE::load(IMLE *this,string *filename)

{
  byte bVar1;
  undefined8 uVar2;
  IMLE *in_RDI;
  text_iarchive archive;
  ifstream fs;
  IMLE *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd24;
  istream *in_stack_fffffffffffffd28;
  text_iarchive *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string local_250 [48];
  undefined1 local_220 [543];
  byte local_1;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,uVar2,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    message(in_RDI,(string *)in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_250);
    local_1 = 0;
  }
  else {
    boost::archive::text_iarchive::text_iarchive
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               CONCAT13(bVar1,(int3)in_stack_fffffffffffffd24));
    reset(in_RDI);
    boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
              ((interface_iarchive<boost::archive::text_iarchive> *)in_RDI,in_stack_fffffffffffffd08
              );
    std::ifstream::close();
    local_1 = 1;
    boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x2f86c2);
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::load(std::string const &filename)
{
    std::ifstream fs(filename.c_str());
	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_iarchive archive(fs);

    reset();
	archive & (*this);
    fs.close();

    return true;
}